

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int allocateBtreePage(BtShared *pBt,MemPage **ppPage,Pgno *pPgno,Pgno nearby,u8 eMode)

{
  u8 uVar1;
  MemPage *pMVar2;
  u8 *puVar3;
  Bitvec *p;
  bool bVar4;
  MemPage *pPage;
  MemPage **ppMVar5;
  Pgno PVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  uint *puVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  int iVar14;
  MemPage *pPage_00;
  uint uVar15;
  uint uVar16;
  MemPage *pPage_01;
  bool bVar17;
  uint local_6c;
  u8 eType;
  MemPage *pTrunk;
  MemPage **local_50;
  uint *local_48;
  Pgno local_3c;
  ulong local_38;
  
  pTrunk = (MemPage *)0x0;
  pMVar2 = pBt->pPage1;
  uVar11 = pBt->nPage;
  uVar12 = *(uint *)(pMVar2->aData + 0x24);
  uVar15 = uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 | uVar12 << 0x18;
  if (uVar11 <= uVar15) {
    iVar7 = sqlite3CorruptError(0xfbb5);
    return iVar7;
  }
  if (uVar12 == 0) {
    uVar1 = pBt->bDoTruncate;
    iVar7 = sqlite3PagerWrite(pMVar2->pDbPage);
    if (iVar7 != 0) {
      return iVar7;
    }
    uVar12 = pBt->nPage;
    uVar11 = uVar12 + 1;
    pBt->nPage = uVar11;
    if (uVar12 == (uint)sqlite3PendingByte / pBt->pageSize) {
      uVar11 = uVar12 + 2;
      pBt->nPage = uVar11;
    }
    uVar12 = (uint)(uVar1 == '\0');
    if ((pBt->autoVacuum != '\0') && (PVar6 = ptrmapPageno(pBt,uVar11), PVar6 == uVar11)) {
      _eType = (MemPage *)0x0;
      iVar7 = btreeGetUnusedPage(pBt,uVar11,(MemPage **)&eType,uVar12);
      pMVar2 = _eType;
      if (iVar7 != 0) {
        return iVar7;
      }
      iVar7 = sqlite3PagerWrite(_eType->pDbPage);
      releasePage(pMVar2);
      if (iVar7 != 0) {
        return iVar7;
      }
      uVar15 = pBt->nPage;
      uVar11 = uVar15 + 1;
      pBt->nPage = uVar11;
      if (uVar15 == (uint)sqlite3PendingByte / pBt->pageSize) {
        uVar11 = uVar15 + 2;
        pBt->nPage = uVar11;
      }
    }
    *(uint *)(pBt->pPage1->aData + 0x1c) =
         uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 | uVar11 << 0x18;
    PVar6 = pBt->nPage;
    *pPgno = PVar6;
    iVar7 = btreeGetUnusedPage(pBt,PVar6,ppPage,uVar12);
    if (iVar7 != 0) {
      return iVar7;
    }
    iVar7 = sqlite3PagerWrite((*ppPage)->pDbPage);
    if (iVar7 == 0) {
      pPage_01 = (MemPage *)0x0;
      pPage_00 = (MemPage *)0x0;
      iVar7 = 0;
      goto LAB_00125a97;
    }
    releasePage(*ppPage);
    *ppPage = (MemPage *)0x0;
    pPage_01 = (MemPage *)0x0;
  }
  else {
    local_50 = ppPage;
    local_48 = pPgno;
    local_3c = nearby;
    if (eMode == '\x02') {
      bVar17 = true;
    }
    else if ((eMode == '\x01') && (nearby <= uVar11)) {
      iVar7 = ptrmapGet(pBt,nearby,&eType,(Pgno *)0x0);
      bVar17 = eType == '\x02';
      if (iVar7 != 0) {
        return iVar7;
      }
    }
    else {
      bVar17 = false;
    }
    iVar7 = sqlite3PagerWrite(pMVar2->pDbPage);
    if (iVar7 != 0) {
      return iVar7;
    }
    uVar12 = uVar15 - 1;
    *(uint *)(pMVar2->aData + 0x24) =
         uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 | uVar12 * 0x1000000;
    local_6c = 0;
    pPage_00 = (MemPage *)0x0;
    local_38 = (ulong)uVar15;
    do {
      bVar4 = bVar17;
      if (pPage_00 == (MemPage *)0x0) {
        puVar10 = (uint *)(pMVar2->aData + 0x20);
      }
      else {
        puVar10 = (uint *)pPage_00->aData;
      }
      uVar12 = *puVar10;
      uVar12 = uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 | uVar12 << 0x18;
      if ((uVar11 < uVar12) || ((uint)local_38 < local_6c)) {
        iVar7 = sqlite3CorruptError(0xfbed);
LAB_00125a52:
        pPage_01 = (MemPage *)0x0;
        goto LAB_00125a97;
      }
      iVar7 = btreeGetUnusedPage(pBt,uVar12,&pTrunk,0);
      puVar10 = local_48;
      pPage_01 = pTrunk;
      if (iVar7 != 0) goto LAB_00125a52;
      puVar3 = pTrunk->aData;
      uVar15 = *(uint *)(puVar3 + 4);
      if ((bVar4) || (uVar15 != 0)) {
        uVar16 = uVar15 >> 0x18 | (uVar15 & 0xff0000) >> 8 | (uVar15 & 0xff00) << 8 | uVar15 << 0x18
        ;
        if ((pBt->usableSize >> 2) - 2 < uVar16) {
          iVar7 = 0xfc0a;
LAB_00125a76:
          iVar7 = sqlite3CorruptError(iVar7);
          goto LAB_00125a97;
        }
        if (bVar4) {
          if ((uVar12 == local_3c) || (eMode == '\x02' && uVar12 < local_3c)) {
            *local_48 = uVar12;
            *local_50 = pTrunk;
            iVar7 = sqlite3PagerWrite(pTrunk->pDbPage);
            if (iVar7 != 0) goto LAB_00125a97;
            if (uVar15 == 0) {
              if (pPage_00 == (MemPage *)0x0) {
                *(undefined4 *)(pMVar2->aData + 0x20) = *(undefined4 *)pPage_01->aData;
              }
              else {
                iVar7 = sqlite3PagerWrite(pPage_00->pDbPage);
                if (iVar7 != 0) goto LAB_00125a97;
                *(undefined4 *)pPage_00->aData = *(undefined4 *)pPage_01->aData;
              }
            }
            else {
              uVar12 = *(uint *)(pPage_01->aData + 8);
              uVar15 = uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 |
                       uVar12 << 0x18;
              if (uVar11 < uVar15) {
                iVar7 = sqlite3CorruptError(0xfc2c);
                goto LAB_00125a97;
              }
              iVar7 = btreeGetUnusedPage(pBt,uVar15,(MemPage **)&eType,0);
              pPage = _eType;
              if (iVar7 != 0) goto LAB_00125a97;
              iVar7 = sqlite3PagerWrite(_eType->pDbPage);
              if (iVar7 != 0) {
                releasePage(pPage);
                goto LAB_00125a97;
              }
              *(undefined4 *)pPage->aData = *(undefined4 *)pPage_01->aData;
              uVar15 = uVar16 - 1;
              *(uint *)(pPage->aData + 4) =
                   uVar15 >> 0x18 | (uVar15 & 0xff0000) >> 8 | (uVar15 & 0xff00) << 8 |
                   uVar15 * 0x1000000;
              memcpy(pPage->aData + 8,pPage_01->aData + 0xc,(ulong)(uVar16 * 4 - 4));
              releasePage(pPage);
              if (pPage_00 == (MemPage *)0x0) {
                puVar10 = (uint *)(pMVar2->aData + 0x20);
              }
              else {
                iVar7 = sqlite3PagerWrite(pPage_00->pDbPage);
                if (iVar7 != 0) goto LAB_00125a97;
                puVar10 = (uint *)pPage_00->aData;
              }
              *puVar10 = uVar12;
            }
            pTrunk = (MemPage *)0x0;
            pPage_01 = (MemPage *)0x0;
            bVar4 = false;
            iVar7 = 0;
            goto LAB_001259f7;
          }
        }
        if (uVar15 != 0) {
          uVar12 = 0;
          if (local_3c != 0) {
            if (eMode == '\x02') {
              uVar15 = 8;
              for (uVar13 = 0; uVar16 != uVar13; uVar13 = uVar13 + 1) {
                uVar8 = *(uint *)(puVar3 + uVar15);
                if ((uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18
                    ) <= local_3c) {
                  uVar12 = (uint)uVar13;
                  break;
                }
                uVar15 = uVar15 + 4;
              }
            }
            else {
              uVar12 = *(uint *)(puVar3 + 8);
              iVar9 = (uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 |
                      uVar12 << 0x18) - local_3c;
              iVar7 = -iVar9;
              if (-1 < iVar9) {
                iVar7 = iVar9;
              }
              uVar12 = 0;
              uVar15 = 0xc;
              for (uVar13 = 1; uVar13 < uVar16; uVar13 = uVar13 + 1) {
                uVar8 = *(uint *)(puVar3 + uVar15);
                iVar14 = (uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 |
                         uVar8 << 0x18) - local_3c;
                iVar9 = -iVar14;
                if (-1 < iVar14) {
                  iVar9 = iVar14;
                }
                if (iVar9 < iVar7) {
                  uVar12 = (uint)uVar13;
                  iVar7 = iVar9;
                }
                uVar15 = uVar15 + 4;
              }
            }
          }
          uVar15 = uVar12 * 4 + 8;
          uVar8 = *(uint *)(puVar3 + uVar15);
          uVar8 = uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18;
          if (uVar11 < uVar8) {
            iVar7 = 0xfc6d;
            goto LAB_00125a76;
          }
          if (((uVar8 == local_3c) || (eMode == '\x02' && uVar8 < local_3c)) || (!bVar4)) {
            *local_48 = uVar8;
            iVar7 = sqlite3PagerWrite(pTrunk->pDbPage);
            if (iVar7 == 0) {
              uVar8 = uVar16 - 1;
              if (uVar12 < uVar8) {
                *(undefined4 *)(puVar3 + uVar15) = *(undefined4 *)(puVar3 + (uVar16 * 4 + 4));
              }
              *(uint *)(puVar3 + 4) =
                   uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 |
                   uVar8 * 0x1000000;
              uVar12 = *puVar10;
              p = pBt->pHasContent;
              uVar15 = 1;
              if ((p != (Bitvec *)0x0) && (uVar15 = 0, uVar12 <= p->iSize)) {
                uVar15 = sqlite3BitvecTest(p,uVar12);
                uVar15 = uVar15 ^ 1;
              }
              ppMVar5 = local_50;
              iVar9 = btreeGetUnusedPage(pBt,uVar12,local_50,uVar15);
              iVar7 = 0;
              if (iVar9 == 0) {
                iVar9 = sqlite3PagerWrite((*ppMVar5)->pDbPage);
                if (iVar9 == 0) {
                  bVar4 = false;
                }
                else {
                  releasePage(*ppMVar5);
                  *ppMVar5 = (MemPage *)0x0;
                  bVar4 = false;
                  iVar7 = iVar9;
                }
              }
              else {
                bVar4 = false;
                iVar7 = iVar9;
              }
              goto LAB_001259f7;
            }
            goto LAB_00125a97;
          }
          bVar4 = true;
        }
        iVar7 = 0;
      }
      else {
        iVar7 = sqlite3PagerWrite(pTrunk->pDbPage);
        if (iVar7 != 0) goto LAB_00125a97;
        *local_48 = uVar12;
        *(undefined4 *)(pMVar2->aData + 0x20) = *(undefined4 *)pPage_01->aData;
        *local_50 = pPage_01;
        pTrunk = (MemPage *)0x0;
        pPage_01 = (MemPage *)0x0;
        bVar4 = false;
        iVar7 = 0;
      }
LAB_001259f7:
      local_6c = local_6c + 1;
      releasePage(pPage_00);
      pPage_00 = pPage_01;
      bVar17 = true;
    } while (bVar4);
  }
  pPage_00 = (MemPage *)0x0;
LAB_00125a97:
  releasePage(pPage_01);
  releasePage(pPage_00);
  return iVar7;
}

Assistant:

static int allocateBtreePage(
  BtShared *pBt,         /* The btree */
  MemPage **ppPage,      /* Store pointer to the allocated page here */
  Pgno *pPgno,           /* Store the page number here */
  Pgno nearby,           /* Search for a page near this one */
  u8 eMode               /* BTALLOC_EXACT, BTALLOC_LT, or BTALLOC_ANY */
){
  MemPage *pPage1;
  int rc;
  u32 n;     /* Number of pages on the freelist */
  u32 k;     /* Number of leaves on the trunk of the freelist */
  MemPage *pTrunk = 0;
  MemPage *pPrevTrunk = 0;
  Pgno mxPage;     /* Total size of the database file */

  assert( sqlite3_mutex_held(pBt->mutex) );
  assert( eMode==BTALLOC_ANY || (nearby>0 && IfNotOmitAV(pBt->autoVacuum)) );
  pPage1 = pBt->pPage1;
  mxPage = btreePagecount(pBt);
  /* EVIDENCE-OF: R-05119-02637 The 4-byte big-endian integer at offset 36
  ** stores stores the total number of pages on the freelist. */
  n = get4byte(&pPage1->aData[36]);
  testcase( n==mxPage-1 );
  if( n>=mxPage ){
    return SQLITE_CORRUPT_BKPT;
  }
  if( n>0 ){
    /* There are pages on the freelist.  Reuse one of those pages. */
    Pgno iTrunk;
    u8 searchList = 0; /* If the free-list must be searched for 'nearby' */
    u32 nSearch = 0;   /* Count of the number of search attempts */
    
    /* If eMode==BTALLOC_EXACT and a query of the pointer-map
    ** shows that the page 'nearby' is somewhere on the free-list, then
    ** the entire-list will be searched for that page.
    */
#ifndef SQLITE_OMIT_AUTOVACUUM
    if( eMode==BTALLOC_EXACT ){
      if( nearby<=mxPage ){
        u8 eType;
        assert( nearby>0 );
        assert( pBt->autoVacuum );
        rc = ptrmapGet(pBt, nearby, &eType, 0);
        if( rc ) return rc;
        if( eType==PTRMAP_FREEPAGE ){
          searchList = 1;
        }
      }
    }else if( eMode==BTALLOC_LE ){
      searchList = 1;
    }
#endif

    /* Decrement the free-list count by 1. Set iTrunk to the index of the
    ** first free-list trunk page. iPrevTrunk is initially 1.
    */
    rc = sqlite3PagerWrite(pPage1->pDbPage);
    if( rc ) return rc;
    put4byte(&pPage1->aData[36], n-1);

    /* The code within this loop is run only once if the 'searchList' variable
    ** is not true. Otherwise, it runs once for each trunk-page on the
    ** free-list until the page 'nearby' is located (eMode==BTALLOC_EXACT)
    ** or until a page less than 'nearby' is located (eMode==BTALLOC_LT)
    */
    do {
      pPrevTrunk = pTrunk;
      if( pPrevTrunk ){
        /* EVIDENCE-OF: R-01506-11053 The first integer on a freelist trunk page
        ** is the page number of the next freelist trunk page in the list or
        ** zero if this is the last freelist trunk page. */
        iTrunk = get4byte(&pPrevTrunk->aData[0]);
      }else{
        /* EVIDENCE-OF: R-59841-13798 The 4-byte big-endian integer at offset 32
        ** stores the page number of the first page of the freelist, or zero if
        ** the freelist is empty. */
        iTrunk = get4byte(&pPage1->aData[32]);
      }
      testcase( iTrunk==mxPage );
      if( iTrunk>mxPage || nSearch++ > n ){
        rc = SQLITE_CORRUPT_BKPT;
      }else{
        rc = btreeGetUnusedPage(pBt, iTrunk, &pTrunk, 0);
      }
      if( rc ){
        pTrunk = 0;
        goto end_allocate_page;
      }
      assert( pTrunk!=0 );
      assert( pTrunk->aData!=0 );
      /* EVIDENCE-OF: R-13523-04394 The second integer on a freelist trunk page
      ** is the number of leaf page pointers to follow. */
      k = get4byte(&pTrunk->aData[4]);
      if( k==0 && !searchList ){
        /* The trunk has no leaves and the list is not being searched. 
        ** So extract the trunk page itself and use it as the newly 
        ** allocated page */
        assert( pPrevTrunk==0 );
        rc = sqlite3PagerWrite(pTrunk->pDbPage);
        if( rc ){
          goto end_allocate_page;
        }
        *pPgno = iTrunk;
        memcpy(&pPage1->aData[32], &pTrunk->aData[0], 4);
        *ppPage = pTrunk;
        pTrunk = 0;
        TRACE(("ALLOCATE: %d trunk - %d free pages left\n", *pPgno, n-1));
      }else if( k>(u32)(pBt->usableSize/4 - 2) ){
        /* Value of k is out of range.  Database corruption */
        rc = SQLITE_CORRUPT_BKPT;
        goto end_allocate_page;
#ifndef SQLITE_OMIT_AUTOVACUUM
      }else if( searchList 
            && (nearby==iTrunk || (iTrunk<nearby && eMode==BTALLOC_LE)) 
      ){
        /* The list is being searched and this trunk page is the page
        ** to allocate, regardless of whether it has leaves.
        */
        *pPgno = iTrunk;
        *ppPage = pTrunk;
        searchList = 0;
        rc = sqlite3PagerWrite(pTrunk->pDbPage);
        if( rc ){
          goto end_allocate_page;
        }
        if( k==0 ){
          if( !pPrevTrunk ){
            memcpy(&pPage1->aData[32], &pTrunk->aData[0], 4);
          }else{
            rc = sqlite3PagerWrite(pPrevTrunk->pDbPage);
            if( rc!=SQLITE_OK ){
              goto end_allocate_page;
            }
            memcpy(&pPrevTrunk->aData[0], &pTrunk->aData[0], 4);
          }
        }else{
          /* The trunk page is required by the caller but it contains 
          ** pointers to free-list leaves. The first leaf becomes a trunk
          ** page in this case.
          */
          MemPage *pNewTrunk;
          Pgno iNewTrunk = get4byte(&pTrunk->aData[8]);
          if( iNewTrunk>mxPage ){ 
            rc = SQLITE_CORRUPT_BKPT;
            goto end_allocate_page;
          }
          testcase( iNewTrunk==mxPage );
          rc = btreeGetUnusedPage(pBt, iNewTrunk, &pNewTrunk, 0);
          if( rc!=SQLITE_OK ){
            goto end_allocate_page;
          }
          rc = sqlite3PagerWrite(pNewTrunk->pDbPage);
          if( rc!=SQLITE_OK ){
            releasePage(pNewTrunk);
            goto end_allocate_page;
          }
          memcpy(&pNewTrunk->aData[0], &pTrunk->aData[0], 4);
          put4byte(&pNewTrunk->aData[4], k-1);
          memcpy(&pNewTrunk->aData[8], &pTrunk->aData[12], (k-1)*4);
          releasePage(pNewTrunk);
          if( !pPrevTrunk ){
            assert( sqlite3PagerIswriteable(pPage1->pDbPage) );
            put4byte(&pPage1->aData[32], iNewTrunk);
          }else{
            rc = sqlite3PagerWrite(pPrevTrunk->pDbPage);
            if( rc ){
              goto end_allocate_page;
            }
            put4byte(&pPrevTrunk->aData[0], iNewTrunk);
          }
        }
        pTrunk = 0;
        TRACE(("ALLOCATE: %d trunk - %d free pages left\n", *pPgno, n-1));
#endif
      }else if( k>0 ){
        /* Extract a leaf from the trunk */
        u32 closest;
        Pgno iPage;
        unsigned char *aData = pTrunk->aData;
        if( nearby>0 ){
          u32 i;
          closest = 0;
          if( eMode==BTALLOC_LE ){
            for(i=0; i<k; i++){
              iPage = get4byte(&aData[8+i*4]);
              if( iPage<=nearby ){
                closest = i;
                break;
              }
            }
          }else{
            int dist;
            dist = sqlite3AbsInt32(get4byte(&aData[8]) - nearby);
            for(i=1; i<k; i++){
              int d2 = sqlite3AbsInt32(get4byte(&aData[8+i*4]) - nearby);
              if( d2<dist ){
                closest = i;
                dist = d2;
              }
            }
          }
        }else{
          closest = 0;
        }

        iPage = get4byte(&aData[8+closest*4]);
        testcase( iPage==mxPage );
        if( iPage>mxPage ){
          rc = SQLITE_CORRUPT_BKPT;
          goto end_allocate_page;
        }
        testcase( iPage==mxPage );
        if( !searchList 
         || (iPage==nearby || (iPage<nearby && eMode==BTALLOC_LE)) 
        ){
          int noContent;
          *pPgno = iPage;
          TRACE(("ALLOCATE: %d was leaf %d of %d on trunk %d"
                 ": %d more free pages\n",
                 *pPgno, closest+1, k, pTrunk->pgno, n-1));
          rc = sqlite3PagerWrite(pTrunk->pDbPage);
          if( rc ) goto end_allocate_page;
          if( closest<k-1 ){
            memcpy(&aData[8+closest*4], &aData[4+k*4], 4);
          }
          put4byte(&aData[4], k-1);
          noContent = !btreeGetHasContent(pBt, *pPgno)? PAGER_GET_NOCONTENT : 0;
          rc = btreeGetUnusedPage(pBt, *pPgno, ppPage, noContent);
          if( rc==SQLITE_OK ){
            rc = sqlite3PagerWrite((*ppPage)->pDbPage);
            if( rc!=SQLITE_OK ){
              releasePage(*ppPage);
              *ppPage = 0;
            }
          }
          searchList = 0;
        }
      }
      releasePage(pPrevTrunk);
      pPrevTrunk = 0;
    }while( searchList );
  }else{
    /* There are no pages on the freelist, so append a new page to the
    ** database image.
    **
    ** Normally, new pages allocated by this block can be requested from the
    ** pager layer with the 'no-content' flag set. This prevents the pager
    ** from trying to read the pages content from disk. However, if the
    ** current transaction has already run one or more incremental-vacuum
    ** steps, then the page we are about to allocate may contain content
    ** that is required in the event of a rollback. In this case, do
    ** not set the no-content flag. This causes the pager to load and journal
    ** the current page content before overwriting it.
    **
    ** Note that the pager will not actually attempt to load or journal 
    ** content for any page that really does lie past the end of the database
    ** file on disk. So the effects of disabling the no-content optimization
    ** here are confined to those pages that lie between the end of the
    ** database image and the end of the database file.
    */
    int bNoContent = (0==IfNotOmitAV(pBt->bDoTruncate))? PAGER_GET_NOCONTENT:0;

    rc = sqlite3PagerWrite(pBt->pPage1->pDbPage);
    if( rc ) return rc;
    pBt->nPage++;
    if( pBt->nPage==PENDING_BYTE_PAGE(pBt) ) pBt->nPage++;

#ifndef SQLITE_OMIT_AUTOVACUUM
    if( pBt->autoVacuum && PTRMAP_ISPAGE(pBt, pBt->nPage) ){
      /* If *pPgno refers to a pointer-map page, allocate two new pages
      ** at the end of the file instead of one. The first allocated page
      ** becomes a new pointer-map page, the second is used by the caller.
      */
      MemPage *pPg = 0;
      TRACE(("ALLOCATE: %d from end of file (pointer-map page)\n", pBt->nPage));
      assert( pBt->nPage!=PENDING_BYTE_PAGE(pBt) );
      rc = btreeGetUnusedPage(pBt, pBt->nPage, &pPg, bNoContent);
      if( rc==SQLITE_OK ){
        rc = sqlite3PagerWrite(pPg->pDbPage);
        releasePage(pPg);
      }
      if( rc ) return rc;
      pBt->nPage++;
      if( pBt->nPage==PENDING_BYTE_PAGE(pBt) ){ pBt->nPage++; }
    }
#endif
    put4byte(28 + (u8*)pBt->pPage1->aData, pBt->nPage);
    *pPgno = pBt->nPage;

    assert( *pPgno!=PENDING_BYTE_PAGE(pBt) );
    rc = btreeGetUnusedPage(pBt, *pPgno, ppPage, bNoContent);
    if( rc ) return rc;
    rc = sqlite3PagerWrite((*ppPage)->pDbPage);
    if( rc!=SQLITE_OK ){
      releasePage(*ppPage);
      *ppPage = 0;
    }
    TRACE(("ALLOCATE: %d from end of file\n", *pPgno));
  }

  assert( *pPgno!=PENDING_BYTE_PAGE(pBt) );

end_allocate_page:
  releasePage(pTrunk);
  releasePage(pPrevTrunk);
  assert( rc!=SQLITE_OK || sqlite3PagerPageRefcount((*ppPage)->pDbPage)<=1 );
  assert( rc!=SQLITE_OK || (*ppPage)->isInit==0 );
  return rc;
}